

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_ngeom(REF_NODE ref_node,REF_GEOM ref_geom,REF_INT type,REF_INT *ngeom)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ngeom_local;
  REF_INT node;
  REF_INT geom;
  REF_MPI ref_mpi;
  REF_INT *ngeom_local_1;
  REF_GEOM pRStack_20;
  REF_INT type_local;
  REF_GEOM ref_geom_local;
  REF_NODE ref_node_local;
  
  _node = ref_node->ref_mpi;
  ref_private_macro_code_rss_1 = 0;
  for (ngeom_local = 0; ngeom_local < ref_geom->max; ngeom_local = ngeom_local + 1) {
    if ((type == ref_geom->descr[ngeom_local * 6]) &&
       (ref_private_macro_code_rss = ref_geom->descr[ngeom_local * 6 + 5],
       _node->id == ref_node->part[ref_private_macro_code_rss])) {
      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1;
    }
  }
  ref_mpi = (REF_MPI)ngeom;
  ngeom_local_1._4_4_ = type;
  pRStack_20 = ref_geom;
  ref_geom_local = (REF_GEOM)ref_node;
  uVar1 = ref_mpi_sum(_node,&ref_private_macro_code_rss_1,ngeom,1,1);
  if (uVar1 == 0) {
    ref_node_local._4_4_ = ref_mpi_bcast(_node,ref_mpi,1,1);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xcfb,"ref_gather_ngeom",(ulong)ref_node_local._4_4_,"bcast");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xcfa,
           "ref_gather_ngeom",(ulong)uVar1,"sum");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_ngeom(REF_NODE ref_node, REF_GEOM ref_geom,
                                    REF_INT type, REF_INT *ngeom) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT geom, node;
  REF_INT ngeom_local;

  ngeom_local = 0;
  each_ref_geom_of(ref_geom, type, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, node)) ngeom_local++;
  }

  RSS(ref_mpi_sum(ref_mpi, &ngeom_local, ngeom, 1, REF_INT_TYPE), "sum");
  RSS(ref_mpi_bcast(ref_mpi, ngeom, 1, REF_INT_TYPE), "bcast");

  return REF_SUCCESS;
}